

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_PREDpp_2021.h
# Opt level: O3

void __thiscall PREDpp<UFPC>::PerformLabeling(PREDpp<UFPC> *this)

{
  long lVar1;
  char *pcVar2;
  int *piVar3;
  Mat1b *pMVar4;
  long lVar5;
  Mat1i *pMVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint *puVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  char *pcVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar3 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar3,piVar3[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar9 = (uint *)operator_new__((ulong)(((*(int *)&pMVar4->field_0xc -
                                           (*(int *)&pMVar4->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                          ((*(int *)&pMVar4->field_0x8 -
                                           (*(int *)&pMVar4->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                  << 2);
  UFPC::P_ = puVar9;
  *puVar9 = 0;
  UFPC::length_ = 1;
  uVar12 = *(uint *)&pMVar4->field_0x8;
  iVar21 = *(int *)&pMVar4->field_0xc;
  lVar24 = *(long *)&pMVar4->field_0x10;
  lVar5 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar27 = iVar21 - 1;
  iVar18 = 0;
  if (iVar21 < 2) {
    lVar22 = 0;
  }
  else {
    do {
      if (*(char *)(lVar24 + iVar18) != '\0') {
        puVar9[UFPC::length_] = UFPC::length_;
        uVar20 = UFPC::length_ + 1;
        *(uint *)(lVar5 + (long)iVar18 * 4) = UFPC::length_;
        UFPC::length_ = uVar20;
        uVar20 = iVar18 + 1;
        if ((int)uVar27 <= (int)uVar20) {
LAB_00251e67:
          lVar22 = (long)(int)uVar20;
          if (*(char *)(lVar24 + lVar22) == '\0') goto LAB_00251e83;
          uVar20 = *(uint *)(lVar5 + (long)iVar18 * 4);
          goto LAB_00251e80;
        }
        lVar22 = (long)(int)uVar20;
        while (*(char *)(lVar24 + lVar22) != '\0') {
          *(undefined4 *)(lVar5 + lVar22 * 4) = *(undefined4 *)(lVar5 + (long)iVar18 * 4);
          lVar22 = lVar22 + 1;
          iVar18 = iVar18 + 1;
          uVar20 = uVar27;
          if (iVar21 + -2 == iVar18) goto LAB_00251e67;
        }
        iVar18 = iVar18 + 1;
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < (int)uVar27);
    lVar22 = (long)iVar18;
  }
  if (*(char *)(lVar24 + lVar22) != '\0') {
    puVar9[UFPC::length_] = UFPC::length_;
    uVar20 = UFPC::length_;
    UFPC::length_ = UFPC::length_ + 1;
LAB_00251e80:
    *(uint *)(lVar5 + lVar22 * 4) = uVar20;
  }
LAB_00251e83:
  if (1 < (int)uVar12) {
    uVar17 = 1;
    lVar24 = 0;
    do {
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar22 = *(long *)&pMVar4->field_0x10;
      lVar23 = **(long **)&pMVar4->field_0x48;
      lVar16 = lVar23 * uVar17;
      lVar5 = lVar22 + lVar16;
      pcVar25 = (char *)(lVar5 - lVar23);
      lVar7 = *(long *)&pMVar6->field_0x10;
      lVar8 = **(long **)&pMVar6->field_0x48;
      lVar13 = lVar8 * uVar17;
      puVar9 = (uint *)(lVar7 + lVar13);
      puVar19 = (uint *)((long)puVar9 - lVar8);
      if (iVar21 < 2) {
        if (*(char *)(lVar22 + lVar16) != '\0') {
          if (*pcVar25 == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar20 = UFPC::length_ + 1;
            *puVar9 = UFPC::length_;
            UFPC::length_ = uVar20;
          }
          else {
            *puVar9 = *puVar19;
          }
        }
      }
      else {
        if (*(char *)(lVar22 + lVar16) == '\0') {
          uVar26 = 0;
          goto LAB_00251f67;
        }
        if (*pcVar25 == '\0') {
          if (pcVar25[1] == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar20 = UFPC::length_ + 1;
            *puVar9 = UFPC::length_;
            UFPC::length_ = uVar20;
            iVar18 = 0;
            goto LAB_002521d1;
          }
          *puVar9 = puVar19[1];
          uVar26 = 0;
          goto LAB_0025225a;
        }
        *puVar9 = *puVar19;
        uVar26 = 0;
LAB_0025228c:
        iVar18 = (int)uVar26;
        uVar20 = iVar18 + 1U;
        if ((int)(iVar18 + 1U) < (int)uVar27) {
          lVar14 = (long)iVar18;
          lVar15 = 0;
          while( true ) {
            if (*(char *)(lVar16 + lVar14 + lVar22 + 1 + lVar15) == '\0') {
              uVar26 = (ulong)(uint)(iVar18 + 1 + (int)lVar15);
              goto LAB_00251f67;
            }
            if (*(char *)(lVar23 * lVar24 + lVar14 + lVar22 + 1 + lVar15) == '\0') break;
            *(undefined4 *)(lVar13 + lVar14 * 4 + lVar7 + 4 + lVar15 * 4) =
                 *(undefined4 *)(lVar8 * lVar24 + lVar14 * 4 + lVar7 + 4 + lVar15 * 4);
            lVar15 = lVar15 + 1;
            if ((lVar14 - (int)uVar27) + 1 + lVar15 == 0) {
              iVar18 = iVar18 + (int)lVar15;
              uVar20 = uVar27;
              goto LAB_0025234a;
            }
          }
          uVar26 = (ulong)(uint)(iVar18 + 1 + (int)lVar15);
LAB_0025220b:
          iVar18 = (int)uVar26;
          if (pcVar25[(long)iVar18 + 1] == '\0') {
            puVar9[iVar18] = puVar9[(long)iVar18 + -1];
            goto LAB_002521d1;
          }
          uVar20 = UFPC::Merge(puVar9[(long)iVar18 + -1],puVar19[(long)iVar18 + 1]);
          puVar9[iVar18] = uVar20;
LAB_0025225a:
          while( true ) {
            lVar14 = (long)(int)uVar26;
            uVar26 = lVar14 + 1;
            if ((int)uVar27 <= (int)uVar26) break;
            if (*(char *)(lVar5 + uVar26) != '\0') {
              puVar9[lVar14 + 1] = puVar19[lVar14 + 1];
              goto LAB_0025228c;
            }
LAB_00251f67:
            while( true ) {
              lVar28 = (long)(int)uVar26;
              lVar14 = lVar28 << 0x20;
              lVar15 = 0;
              do {
                lVar10 = lVar14;
                lVar11 = lVar10 >> 0x20;
                if ((long)(int)uVar27 <= lVar28 + lVar15 + 1) {
                  uVar26 = (ulong)((int)lVar15 + (int)uVar26 + 1);
                  if (*(char *)(lVar5 + uVar26) == '\0') goto LAB_002523e0;
                  if (pcVar25[uVar26] != '\0') {
                    uVar20 = puVar19[uVar26];
                    goto LAB_00252203;
                  }
                  if (pcVar25[lVar11] == '\0') {
                    UFPC::P_[UFPC::length_] = UFPC::length_;
                    uVar20 = UFPC::length_ + 1;
                    puVar9[uVar26] = UFPC::length_;
                    UFPC::length_ = uVar20;
                    goto LAB_002523e0;
                  }
                  uVar20 = puVar19[lVar11];
                  goto LAB_00252203;
                }
                lVar1 = lVar15 + 1;
                pcVar2 = (char *)(lVar22 + lVar16 + lVar28 + 1 + lVar15);
                lVar14 = lVar10 + 0x100000000;
                lVar15 = lVar1;
              } while (*pcVar2 == '\0');
              uVar26 = (uVar26 & 0xffffffff) + lVar1;
              iVar18 = (int)uVar26;
              if (*(char *)(lVar1 + lVar23 * lVar24 + lVar28 + lVar22) != '\0') {
                *(undefined4 *)(lVar13 + lVar28 * 4 + lVar7 + lVar1 * 4) =
                     *(undefined4 *)(lVar8 * lVar24 + lVar28 * 4 + lVar7 + lVar1 * 4);
                goto LAB_0025228c;
              }
              lVar14 = lVar10 + 0x200000000 >> 0x20;
              if (pcVar25[lVar14] != '\0') break;
              if (pcVar25[lVar11] == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar20 = UFPC::length_ + 1;
                *(uint *)(lVar13 + lVar28 * 4 + lVar7 + lVar1 * 4) = UFPC::length_;
                UFPC::length_ = uVar20;
              }
              else {
                *(uint *)(lVar13 + lVar28 * 4 + lVar7 + lVar1 * 4) = puVar19[lVar11];
              }
LAB_002521d1:
              uVar26 = (long)iVar18 + 1;
              if ((int)uVar27 <= (int)uVar26) {
                uVar26 = uVar26 & 0xffffffff;
                if (*(char *)(lVar5 + uVar26) != '\0') {
                  uVar20 = puVar9[iVar18];
LAB_00252203:
                  puVar9[uVar26] = uVar20;
                }
                goto LAB_002523e0;
              }
              if (*(char *)(lVar5 + uVar26) != '\0') goto LAB_0025220b;
            }
            if (pcVar25[lVar11] == '\0') {
              *(uint *)(lVar13 + lVar28 * 4 + lVar7 + lVar1 * 4) = puVar19[lVar14];
            }
            else {
              uVar20 = UFPC::Merge(puVar19[lVar14],puVar19[lVar11]);
              *(uint *)(lVar13 + lVar28 * 4 + lVar7 + lVar1 * 4) = uVar20;
            }
          }
          uVar26 = uVar26 & 0xffffffff;
          if (*(char *)(lVar5 + uVar26) == '\0') goto LAB_002523e0;
          uVar20 = puVar19[uVar26];
          goto LAB_002523dd;
        }
LAB_0025234a:
        uVar26 = (ulong)uVar20;
        if (*(char *)(lVar5 + uVar26) != '\0') {
          if (pcVar25[uVar26] == '\0') {
            uVar20 = puVar9[iVar18];
          }
          else {
            uVar20 = puVar19[uVar26];
          }
LAB_002523dd:
          puVar9[uVar26] = uVar20;
        }
      }
LAB_002523e0:
      uVar17 = uVar17 + 1;
      lVar24 = lVar24 + 1;
      puVar9 = UFPC::P_;
    } while (uVar17 != uVar12);
  }
  uVar12 = 1;
  if (1 < UFPC::length_) {
    uVar12 = 1;
    uVar17 = 1;
    do {
      if (puVar9[uVar17] < uVar17) {
        uVar27 = puVar9[puVar9[uVar17]];
      }
      else {
        uVar27 = uVar12;
        uVar12 = uVar12 + 1;
      }
      puVar9[uVar17] = uVar27;
      uVar17 = uVar17 + 1;
    } while (uVar17 < UFPC::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar12;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar21 = *(int *)&pMVar6->field_0x8;
  if (0 < iVar21) {
    lVar24 = *(long *)&pMVar6->field_0x10;
    lVar5 = **(long **)&pMVar6->field_0x48;
    lVar22 = 0;
    do {
      iVar18 = *(int *)&pMVar6->field_0xc;
      if ((long)iVar18 != 0) {
        lVar23 = 0;
        do {
          *(uint *)(lVar24 + lVar23) = puVar9[*(uint *)(lVar24 + lVar23)];
          lVar23 = lVar23 + 4;
        } while ((long)iVar18 * 4 != lVar23);
        iVar21 = *(int *)&pMVar6->field_0x8;
      }
      lVar22 = lVar22 + 1;
      lVar24 = lVar24 + lVar5;
    } while (lVar22 < iVar21);
  }
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        //Conditions:
#define CONDITION_P img_row11[c - 1] > 0
#define CONDITION_Q img_row11[c] > 0
#define CONDITION_R img_row11[c + 1] > 0
#define CONDITION_S img_row00[c - 1] > 0
#define CONDITION_X img_row00[c] > 0


//Actions:
// Action 1: nothing
#define ACTION_1 
// Action 2: x<-newlabel
#define ACTION_2 img_labels_row00[c] = LabelsSolver::NewLabel();
// Action 3: x<-p
#define ACTION_3 img_labels_row00[c] = img_labels_row11[c - 1];
// Action 4: x<-q
#define ACTION_4 img_labels_row00[c] = img_labels_row11[c];
// Action 5: x<-r
#define ACTION_5 img_labels_row00[c] = img_labels_row11[c + 1];
// Action 6: x<-p+r
#define ACTION_6 img_labels_row00[c] = LabelsSolver::Merge(img_labels_row11[c + 1], img_labels_row11[c - 1]);
// Action 7: x<-s
#define ACTION_7 img_labels_row00[c] = img_labels_row00[c - 1];
// Action 8: x<-r+s
#define ACTION_8 img_labels_row00[c] = LabelsSolver::Merge(img_labels_row00[c - 1], img_labels_row11[c + 1]);


#define COLS w

        {
            int c = -1;

            const unsigned char* const img_row00 = img_.ptr<unsigned char>(0);

            // Row pointers for the output image 
            unsigned* const img_labels_row00 = img_labels_.ptr<unsigned>(0);
            goto fl_tree_0;
#include "labeling_PREDpp_2021_fl_forest.inc.h"
        }

        for (int r = 1; r < h; ++r) {
            int c = -1;
            // Get rows pointer
    // Row pointers for the input image 
            const unsigned char* const img_row00 = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row11 = (unsigned char *)(((char *)img_row00) + img_.step.p[0] * -1);

            // Row pointers for the output image 
            unsigned* const img_labels_row00 = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row11 = (unsigned *)(((char *)img_labels_row00) + img_labels_.step.p[0] * -1);
            goto cl_tree_0;
#include "labeling_PREDpp_2021_cl_forest.inc.h"

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }